

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O1

int comex_gets(void *src_ptr,int *src_stride_ar,void *dst_ptr,int *dst_stride_ar,int *count,
              int stride_levels,int proc,comex_group_t group)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *__assertion;
  long lVar9;
  size_t __n;
  int src_bvalue [7];
  int dst_bvalue [7];
  int src_bunit [7];
  int dst_bunit [7];
  int local_c8 [2];
  undefined1 local_c0 [24];
  void *local_a8;
  void *local_a0;
  undefined8 local_98;
  undefined1 local_90 [24];
  int local_78 [8];
  undefined8 local_58;
  int aiStack_50 [8];
  
  local_a8 = src_ptr;
  local_a0 = dst_ptr;
  iVar2 = comex_group_size(group,local_c8);
  if (iVar2 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < local_c8[0]) {
        if (group != 0) {
          comex_group_translate_world(group,proc,local_78);
          proc = local_78[0];
        }
        if (stride_levels < 1) {
          iVar2 = 1;
        }
        else {
          iVar2 = 1;
          uVar4 = 1;
          do {
            iVar2 = iVar2 * count[uVar4];
            uVar4 = uVar4 + 1;
          } while (stride_levels + 1 != uVar4);
        }
        local_c8[0] = 0;
        local_c8[1] = 0;
        local_78[0] = 1;
        local_78[1] = 1;
        local_98 = 0;
        local_58 = 0x100000001;
        if (1 < stride_levels) {
          __n = (ulong)(stride_levels - 1) << 2;
          lVar6 = 0;
          memset(local_c0,0,__n);
          memset(local_90,0,__n);
          iVar3 = local_58._4_4_;
          iVar5 = local_78[1];
          do {
            iVar1 = count[lVar6 + 1];
            iVar5 = iVar5 * iVar1;
            local_78[lVar6 + 2] = iVar5;
            iVar3 = iVar3 * iVar1;
            aiStack_50[lVar6] = iVar3;
            lVar6 = lVar6 + 1;
          } while ((ulong)(uint)stride_levels - 1 != lVar6);
        }
        if (0 < iVar2) {
          lVar6 = (ulong)(stride_levels + 1) - 1;
          iVar3 = 0;
          do {
            if (stride_levels < 1) {
              lVar8 = 0;
            }
            else {
              lVar7 = 0;
              lVar8 = 0;
              do {
                iVar5 = *(int *)(local_c0 + lVar7 * 4 + -4);
                if ((iVar3 + 1) % local_78[lVar7 + 1] == 0) {
                  *(int *)(local_c0 + lVar7 * 4 + -4) = iVar5 + 1;
                }
                lVar8 = lVar8 + (long)src_stride_ar[lVar7] * (long)iVar5;
                iVar5 = *(int *)(local_c0 + lVar7 * 4 + -4);
                if (count[lVar7 + 1] <= iVar5) {
                  iVar5 = 0;
                }
                *(int *)(local_c0 + lVar7 * 4 + -4) = iVar5;
                lVar7 = lVar7 + 1;
              } while (lVar6 != lVar7);
            }
            if (stride_levels < 1) {
              lVar7 = 0;
            }
            else {
              lVar9 = 0;
              lVar7 = 0;
              do {
                iVar5 = *(int *)(local_90 + lVar9 * 4 + -4);
                if ((iVar3 + 1) % aiStack_50[lVar9 + -1] == 0) {
                  *(int *)(local_90 + lVar9 * 4 + -4) = iVar5 + 1;
                }
                lVar7 = lVar7 + (long)dst_stride_ar[lVar9] * (long)iVar5;
                iVar5 = *(int *)(local_90 + lVar9 * 4 + -4);
                if (count[lVar9 + 1] <= iVar5) {
                  iVar5 = 0;
                }
                *(int *)(local_90 + lVar9 * 4 + -4) = iVar5;
                lVar9 = lVar9 + 1;
              } while (lVar6 != lVar9);
            }
            _get_nbi((void *)(lVar8 + (long)local_a8),(void *)(lVar7 + (long)local_a0),*count,proc);
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar2);
        }
        comex_make_progress();
        return 0;
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x359,
                "int comex_gets(void *, int *, void *, int *, int *, int, int, comex_group_t)");
}

Assistant:

int comex_gets(
        void *src_ptr, int *src_stride_ar,
        void *dst_ptr, int *dst_stride_ar,
        int *count, int stride_levels,
        int proc, comex_group_t group)
{
    int i, j;
    long src_idx, dst_idx;  /* index offset of current block position to ptr */
    int n1dim;  /* number of 1 dim block */
    int src_bvalue[7], src_bunit[7];
    int dst_bvalue[7], dst_bunit[7];

    CHECK_GROUP(group,proc);
#if DEBUG
    if (stride_levels) {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar[0]=%d, dst_ptr=%p, dst_stride_ar[0]=%d, count[0]=%d, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, src_stride_ar[0], dst_ptr, dst_stride_ar[0], count[0], stride_levels, proc);
    }
    else {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar=NULL, dst_ptr=%p, dst_stride_ar=NULL, count=NULL, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, dst_ptr, stride_levels, proc);
    }
#endif

    /* number of n-element of the first dimension */
    n1dim = 1;
    for(i=1; i<=stride_levels; i++) {
        n1dim *= count[i];
    }

    /* calculate the destination indices */
    src_bvalue[0] = 0; src_bvalue[1] = 0; src_bunit[0] = 1; src_bunit[1] = 1;
    dst_bvalue[0] = 0; dst_bvalue[1] = 0; dst_bunit[0] = 1; dst_bunit[1] = 1;

    for(i=2; i<=stride_levels; i++) {
        src_bvalue[i] = 0;
        dst_bvalue[i] = 0;
        src_bunit[i] = src_bunit[i-1] * count[i-1];
        dst_bunit[i] = dst_bunit[i-1] * count[i-1];
    }

    for(i=0; i<n1dim; i++) {
        src_idx = 0;
        for(j=1; j<=stride_levels; j++) {
	  src_idx += (long) src_bvalue[j] * (long) src_stride_ar[j-1];
            if((i+1) % src_bunit[j] == 0) {
                src_bvalue[j]++;
            }
            if(src_bvalue[j] > (count[j]-1)) {
                src_bvalue[j] = 0;
            }
        }

        dst_idx = 0;
        
        for(j=1; j<=stride_levels; j++) {
	  dst_idx += (long) dst_bvalue[j] * (long) dst_stride_ar[j-1];
            if((i+1) % dst_bunit[j] == 0) {
                dst_bvalue[j]++;
            }
            if(dst_bvalue[j] > (count[j]-1)) {
                dst_bvalue[j] = 0;
            }
        }
        
        _get_nbi((char *)src_ptr + src_idx, 
                (char *)dst_ptr + dst_idx, count[0], proc);
    }
    
    comex_wait_proc(proc, group);
    
    return COMEX_SUCCESS;
}